

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_processor_xmi.cpp
# Opt level: O2

void __thiscall iff_chunk::iff_chunk(iff_chunk *this,iff_chunk *p_in)

{
  (this->m_sub_chunks).super__Vector_base<iff_chunk,_std::allocator<iff_chunk>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_sub_chunks).super__Vector_base<iff_chunk,_std::allocator<iff_chunk>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_sub_chunks).super__Vector_base<iff_chunk,_std::allocator<iff_chunk>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined4 *)this->m_id = *(undefined4 *)p_in->m_id;
  *(undefined4 *)this->m_type = *(undefined4 *)p_in->m_type;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&this->m_data,&p_in->m_data)
  ;
  std::vector<iff_chunk,_std::allocator<iff_chunk>_>::operator=
            (&this->m_sub_chunks,&p_in->m_sub_chunks);
  return;
}

Assistant:

iff_chunk( const iff_chunk & p_in )
    {
        memcpy( m_id, p_in.m_id, sizeof( m_id ) );
        memcpy( m_type, p_in.m_type, sizeof( m_type ) );
        m_data = p_in.m_data;
        m_sub_chunks = p_in.m_sub_chunks;
    }